

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
AnalyzeShortFunctionDefinition
          (ExpressionContext *ctx,SynShortFunctionDefinition *syntax,FunctionData *genericProto,
          TypeFunction *argumentType)

{
  bool bVar1;
  Allocator *pAVar2;
  SynIdentifier *pSVar3;
  ArrayView<ArgumentData> argData_00;
  int iVar4;
  TypeBase *pTVar5;
  char *dst;
  TypeBase *pTVar6;
  SynIdentifier *pSVar7;
  size_t sVar8;
  undefined4 extraout_var_01;
  MatchData *node;
  TypeFunction *instanceType;
  ExprBase *pEVar9;
  VariableData *context;
  ExprVariableDefinition *pEVar10;
  TypeBase *returnType;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  SynShortFunctionArgument *pSVar14;
  TypeHandle *pTVar15;
  long lVar16;
  MatchData *in_R9;
  SynShortFunctionArgument *pSVar17;
  TypeHandle *pTVar18;
  IntrusiveList<MatchData> argCasts_00;
  ArrayView<ArgumentData> arguments;
  IntrusiveList<MatchData> argCasts;
  IntrusiveList<MatchData> aliases;
  SmallArray<ArgumentData,_32U> argData;
  char *local_698;
  IntrusiveList<MatchData> local_678;
  ArgumentData *local_668;
  uint uStack_660;
  undefined4 uStack_65c;
  IntrusiveList<MatchData> local_658;
  SmallArray<ArgumentData,_32U> local_648;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  pSVar17 = (syntax->arguments).head;
  iVar4 = 0;
  iVar12 = 0;
  if (pSVar17 != (SynShortFunctionArgument *)0x0) {
    iVar12 = 0;
    pSVar14 = pSVar17;
    do {
      iVar12 = iVar12 + 1;
      pSVar14 = (SynShortFunctionArgument *)(pSVar14->super_SynBase).next;
    } while (pSVar14 != (SynShortFunctionArgument *)0x0);
  }
  pTVar18 = (argumentType->arguments).head;
  if (pTVar18 != (TypeHandle *)0x0) {
    iVar4 = 0;
    pTVar15 = pTVar18;
    do {
      iVar4 = iVar4 + 1;
      pTVar15 = pTVar15->next;
    } while (pTVar15 != (TypeHandle *)0x0);
  }
  if (iVar12 == iVar4) {
    returnType = argumentType->returnType;
    bVar1 = returnType->isGeneric;
    pTVar5 = ctx->typeAuto;
    local_678.head = (MatchData *)0x0;
    local_678.tail = (MatchData *)0x0;
    pAVar2 = ctx->allocator;
    lVar16 = 0x20;
    do {
      *(undefined8 *)((long)&local_658.head + lVar16) = 0;
      *(undefined1 *)((long)local_648.little + lVar16 + -0x18) = 0;
      *(undefined8 *)((long)local_648.little + lVar16 + -0x10) = 0;
      *(undefined8 *)((long)local_648.little + lVar16 + -8) = 0;
      *(undefined8 *)((long)&local_648.little[0].source + lVar16) = 0;
      *(undefined8 *)(&local_648.little[0].isExplicit + lVar16) = 0;
      lVar16 = lVar16 + 0x30;
    } while (lVar16 != 0x620);
    if (bVar1 != false) {
      returnType = pTVar5;
    }
    local_648.data = local_648.little;
    local_648.count = 0;
    local_648.max = 0x20;
    local_648.allocator = pAVar2;
    if (pSVar17 == (SynShortFunctionArgument *)0x0) {
      uVar11 = 0;
    }
    else {
      local_698 = "ERROR: function argument cannot be an auto type";
      do {
        if (pSVar17->type == (SynBase *)0x0) {
LAB_0015f8cd:
          pSVar3 = pSVar17->name;
          pTVar5 = pTVar18->type;
          if (local_648.count == local_648.max) {
            SmallArray<ArgumentData,_32U>::grow(&local_648,local_648.count);
          }
          if (local_648.data == (ArgumentData *)0x0) {
LAB_0015fb22:
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<ArgumentData, 32>::push_back(const T &) [T = ArgumentData, N = 32]"
                         );
          }
          uVar11 = local_648._8_8_ & 0xffffffff;
          local_648.count = local_648.count + 1;
          local_648.data[uVar11].source = &pSVar17->super_SynBase;
          local_648.data[uVar11].isExplicit = false;
          local_648.data[uVar11].name = pSVar3;
          local_648.data[uVar11].type = pTVar5;
          local_648.data[uVar11].value = (ExprBase *)0x0;
          (&local_648.data[uVar11].value)[1] = (ExprBase *)0x0;
        }
        else {
          pTVar5 = AnalyzeType(ctx,pSVar17->type,true,(bool *)0x0);
          if (pTVar5 == (TypeBase *)0x0) goto LAB_0015f8cd;
          if (pTVar5 == ctx->typeAuto) {
LAB_0015fb4d:
            anon_unknown.dwarf_9c70f::Stop(ctx,&syntax->super_SynBase,local_698);
          }
          if (pTVar5 == ctx->typeVoid) {
            local_698 = "ERROR: function argument cannot be a void type";
            goto LAB_0015fb4d;
          }
          if (pTVar5->typeID == 0) goto LAB_0015fafd;
          uVar13 = (*(int *)&(pSVar17->name->name).end - *(int *)&(pSVar17->name->name).begin) + 2;
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar13);
          dst = (char *)CONCAT44(extraout_var,iVar4);
          NULLC::SafeSprintf(dst,(ulong)uVar13,"%.*s$",
                             (ulong)(uint)(*(int *)&(pSVar17->name->name).end -
                                          (int)(pSVar17->name->name).begin));
          if (pTVar18->type->isGeneric == true) {
            local_658.head = (MatchData *)0x0;
            local_658.tail = (MatchData *)0x0;
            in_R9 = (MatchData *)0x0;
            pTVar6 = MatchGenericType(ctx,&syntax->super_SynBase,pTVar18->type,pTVar5,&local_658,
                                      false);
            if (pTVar6 == (TypeBase *)0x0) goto LAB_0015fafd;
            iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            pSVar7 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar4);
            pSVar3 = pSVar17->name;
            sVar8 = strlen(dst);
            SynBase::SynBase((SynBase *)pSVar7,4,(pSVar3->super_SynBase).begin,
                             (pSVar3->super_SynBase).end);
            (pSVar7->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
            (pSVar7->name).begin = dst;
            (pSVar7->name).end = dst + sVar8;
            if (local_648.count == local_648.max) {
              SmallArray<ArgumentData,_32U>::grow(&local_648,local_648.count);
            }
            if (local_648.data == (ArgumentData *)0x0) goto LAB_0015fb22;
            uVar11 = local_648._8_8_ & 0xffffffff;
            local_648.count = local_648.count + 1;
            local_648.data[uVar11].source = &pSVar17->super_SynBase;
            local_648.data[uVar11].isExplicit = false;
            local_648.data[uVar11].name = pSVar7;
            local_648.data[uVar11].type = pTVar6;
            local_648.data[uVar11].value = (ExprBase *)0x0;
            (&local_648.data[uVar11].value)[1] = (ExprBase *)0x0;
          }
          else {
            iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            pSVar7 = (SynIdentifier *)CONCAT44(extraout_var_01,iVar4);
            pSVar3 = pSVar17->name;
            sVar8 = strlen(dst);
            SynBase::SynBase((SynBase *)pSVar7,4,(pSVar3->super_SynBase).begin,
                             (pSVar3->super_SynBase).end);
            (pSVar7->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
            (pSVar7->name).begin = dst;
            (pSVar7->name).end = dst + sVar8;
            pTVar6 = pTVar18->type;
            if (local_648.count == local_648.max) {
              SmallArray<ArgumentData,_32U>::grow(&local_648,local_648.count);
            }
            if (local_648.data == (ArgumentData *)0x0) goto LAB_0015fb22;
            uVar11 = local_648._8_8_ & 0xffffffff;
            local_648.count = local_648.count + 1;
            local_648.data[uVar11].source = &pSVar17->super_SynBase;
            local_648.data[uVar11].isExplicit = false;
            local_648.data[uVar11].name = pSVar7;
            local_648.data[uVar11].type = pTVar6;
            local_648.data[uVar11].value = (ExprBase *)0x0;
            (&local_648.data[uVar11].value)[1] = (ExprBase *)0x0;
          }
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          node = (MatchData *)CONCAT44(extraout_var_02,iVar4);
          pSVar3 = pSVar17->name;
          node->name = pSVar3;
          node->type = pTVar5;
          node->next = (MatchData *)0x0;
          node->listed = false;
          if (pSVar3 == (SynIdentifier *)0x0) {
            __assert_fail("name",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                          ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
          }
          IntrusiveList<MatchData>::push_back(&local_678,node);
        }
        pSVar17 = (SynShortFunctionArgument *)(pSVar17->super_SynBase).next;
      } while ((pSVar17 != (SynShortFunctionArgument *)0x0) &&
              (pTVar18 = pTVar18->next, (pSVar17->super_SynBase).typeID == 0x38));
      uVar11 = local_648._8_8_ & 0xffffffff;
    }
    arguments._8_8_ = uVar11;
    arguments.data = local_648.data;
    instanceType = ExpressionContext::GetFunctionType
                             (ctx,&syntax->super_SynBase,returnType,arguments);
    local_668 = local_648.data;
    uStack_660 = local_648.count;
    argData_00._12_4_ = uStack_65c;
    argData_00.count = local_648.count;
    argData_00.data = local_648.data;
    argCasts_00.tail = in_R9;
    argCasts_00.head = local_678.head;
    pEVar9 = AnalyzeShortFunctionDefinition
                       (ctx,syntax,genericProto,instanceType,argCasts_00,argData_00);
    if (pEVar9 == (ExprBase *)0x0) {
LAB_0015fafd:
      pEVar9 = (ExprBase *)0x0;
    }
    else if (pEVar9->typeID == 0x24) {
      context = CreateFunctionContextVariable
                          (ctx,&syntax->super_SynBase,(FunctionData *)pEVar9[1]._vptr_ExprBase,
                           (FunctionData *)0x0);
      pEVar9[2].source = (SynBase *)context;
      pEVar10 = CreateFunctionContextVariableDefinition
                          (ctx,&syntax->super_SynBase,(FunctionData *)pEVar9[1]._vptr_ExprBase,
                           (FunctionData *)0x0,context);
      *(ExprVariableDefinition **)&pEVar9[2].typeID = pEVar10;
    }
    SmallArray<ArgumentData,_32U>::~SmallArray(&local_648);
  }
  else {
    pEVar9 = (ExprBase *)0x0;
  }
  return pEVar9;
}

Assistant:

ExprBase* AnalyzeShortFunctionDefinition(ExpressionContext &ctx, SynShortFunctionDefinition *syntax, FunctionData *genericProto, TypeFunction *argumentType)
{
	if(syntax->arguments.size() != argumentType->arguments.size())
		return NULL;

	TypeBase *returnType = argumentType->returnType;

	if(returnType->isGeneric)
		returnType = ctx.typeAuto;

	IntrusiveList<MatchData> argCasts;
	SmallArray<ArgumentData, 32> argData(ctx.allocator);

	TypeHandle *expected = argumentType->arguments.head;

	for(SynShortFunctionArgument *param = syntax->arguments.head; param; param = getType<SynShortFunctionArgument>(param->next))
	{
		TypeBase *type = NULL;

		if(param->type)
			type = AnalyzeType(ctx, param->type);

		if(type)
		{
			if(type == ctx.typeAuto)
				Stop(ctx, syntax, "ERROR: function argument cannot be an auto type");

			if(type == ctx.typeVoid)
				Stop(ctx, syntax, "ERROR: function argument cannot be a void type");

			if(isType<TypeError>(type))
				return NULL;

			unsigned length = param->name->name.length() + 2;
			char *name = (char*)ctx.allocator->alloc(length);

			NULLC::SafeSprintf(name, length, "%.*s$", FMT_ISTR(param->name->name));

			if(expected->type->isGeneric)
			{
				IntrusiveList<MatchData> aliases;

				if(TypeBase *match = MatchGenericType(ctx, syntax, expected->type, type, aliases, false))
					argData.push_back(ArgumentData(param, false, new (ctx.get<SynIdentifier>()) SynIdentifier(param->name, InplaceStr(name)), match, NULL));
				else
					return NULL;
			}
			else
			{
				argData.push_back(ArgumentData(param, false, new (ctx.get<SynIdentifier>()) SynIdentifier(param->name, InplaceStr(name)), expected->type, NULL));
			}

			argCasts.push_back(new (ctx.get<MatchData>()) MatchData(param->name, type));
		}
		else
		{
			argData.push_back(ArgumentData(param, false, param->name, expected->type, NULL));
		}

		expected = expected->next;
	}

	TypeFunction *instanceType = ctx.GetFunctionType(syntax, returnType, argData);

	ExprBase *definition = AnalyzeShortFunctionDefinition(ctx, syntax, genericProto, instanceType, argCasts, argData);

	if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(definition))
	{
		node->contextVariable = CreateFunctionContextVariable(ctx, syntax, node->function, NULL);
		node->contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, syntax, node->function, NULL, node->contextVariable);
	}

	return definition;
}